

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator<int,2ul>
          (iuValuesInParamsGenerator<int> *this,int (*values) [2])

{
  params_t *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator local_20;
  int (*local_18) [2];
  int (*values_local) [2];
  iuValuesInParamsGenerator<int> *this_local;
  
  local_18 = values;
  values_local = (int (*) [2])this;
  iuIParamGenerator<int>::iuIParamGenerator(&this->super_iuIParamGenerator<int>);
  (this->super_iuIParamGenerator<int>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_001844f0;
  this_00 = &this->m_values;
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
  __normal_iterator(&this->m_it);
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_20,
             &local_28);
  std::vector<int,std::allocator<int>>::insert<int_const*,void>
            ((vector<int,std::allocator<int>> *)this_00,local_20,*local_18,local_18[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }